

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Request * __thiscall
kj::anon_unknown_36::PromiseNetworkAddressHttpClient::request
          (Request *__return_storage_ptr__,PromiseNetworkAddressHttpClient *this,HttpMethod method,
          StringPtr url,HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  NetworkAddressHttpClient *this_00;
  _func_int **pp_Var1;
  Maybe<unsigned_long> expectedBodySize_00;
  SourceLocation location;
  void *pvVar2;
  char *pcVar3;
  undefined4 in_register_00000014;
  void *__child_stack;
  ForkHub<kj::_::Void> *location_00;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6219:11),_void>
  combined;
  void *continuationTracePtr;
  String urlCopy;
  SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  split;
  HttpHeaders headersCopy;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_stack_fffffffffffffe50;
  ForkedPromise<void> local_1a0;
  PromiseBase local_190;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_188;
  code *local_180;
  Array<char> local_178;
  char *local_160;
  char *pcStack_158;
  undefined8 local_150;
  char local_148 [8];
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_140;
  char *local_138;
  void *local_130;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_128;
  undefined1 local_120 [8];
  PromiseBase local_118;
  bool local_110;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_108;
  char *local_100;
  size_t local_f8;
  ArrayDisposer *pAStack_f0;
  HttpHeaders local_e8;
  HttpHeaders local_88;
  
  pvVar2 = (void *)url.content.size_;
  pcVar3 = url.content.ptr;
  this_00 = (this->client).ptr.ptr;
  local_138 = pcVar3;
  local_130 = pvVar2;
  if (this_00 == (NetworkAddressHttpClient *)0x0) {
    str<kj::StringPtr&>((String *)&local_178,(kj *)&local_138,
                        (StringPtr *)CONCAT44(in_register_00000014,method));
    HttpHeaders::clone(&local_88,(__fn *)headers,__child_stack,(int)pcVar3,pvVar2);
    ForkedPromise<void>::addBranch(&local_1a0);
    local_118.node.ptr._0_4_ = method;
    local_110 = (expectedBodySize->ptr).isSet;
    if (local_110 == true) {
      local_108 = (expectedBodySize->ptr).field_1;
    }
    local_100 = local_178.ptr;
    local_f8 = local_178.size_;
    pAStack_f0 = local_178.disposer;
    local_178.ptr = (char *)0x0;
    local_178.size_ = 0;
    local_120 = (undefined1  [8])this;
    HttpHeaders::HttpHeaders(&local_e8,&local_88);
    local_180 = kj::_::
                SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6219:11)>
                ::anon_class_152_5_b9fef01d_for_func::operator();
    pp_Var1 = local_1a0.hub.disposer[1]._vptr_Disposer;
    if (pp_Var1 == (_func_int **)0x0 || (ulong)((long)local_1a0.hub.disposer - (long)pp_Var1) < 0xb8
       ) {
      pvVar2 = operator_new(0x400);
      location_00 = (ForkHub<kj::_::Void> *)((long)pvVar2 + 0x348);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6219:11)>
                  *)location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1a0,
                 (anon_class_152_5_b9fef01d_for_func *)local_120,&local_180);
      *(void **)((long)pvVar2 + 0x350) = pvVar2;
    }
    else {
      local_1a0.hub.disposer[1]._vptr_Disposer = (_func_int **)0x0;
      location_00 = (ForkHub<kj::_::Void> *)(local_1a0.hub.disposer + -0x17);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6219:11)>
                  *)location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1a0,
                 (anon_class_152_5_b9fef01d_for_func *)local_120,&local_180);
      local_1a0.hub.disposer[-0x16]._vptr_Disposer = pp_Var1;
    }
    local_188.ptr = (PromiseNode *)0x0;
    local_128.ptr = (PromiseNode *)0x0;
    local_1a0.hub.ptr = location_00;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_128);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_188);
    (anonymous_namespace)::PromiseNetworkAddressHttpClient::
    request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::
    {lambda()#1}::~Maybe((_lambda___1_ *)local_120);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1a0);
    local_160 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    pcStack_158 = "request";
    local_150 = 0x1400001851;
    location.function = "request";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    location.lineNumber = 0x1851;
    location.columnNumber = 0x14;
    Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
    ::split((Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
             *)local_120,location);
    local_190.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_120;
    local_120 = (undefined1  [8])0x0;
    newPromisedStream((kj *)__return_storage_ptr__,
                      (Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_> *)&local_190);
    (__return_storage_ptr__->response).super_PromiseBase.node.ptr =
         (PromiseNode *)local_118.node.ptr;
    local_118.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_190.node);
    kj::_::
    TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>,_kj::Promise<kj::HttpClient::Response>_>
    ::~TupleImpl((TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>,_kj::Promise<kj::HttpClient::Response>_>
                  *)local_120);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1a0.hub.ptr);
    HttpHeaders::~HttpHeaders(&local_88);
    Array<char>::~Array(&local_178);
  }
  else {
    local_148[0] = (expectedBodySize->ptr).isSet;
    if ((bool)local_148[0] == true) {
      local_140 = (expectedBodySize->ptr).field_1;
    }
    expectedBodySize_00.ptr.field_1.value = in_stack_fffffffffffffe50.value;
    expectedBodySize_00.ptr._0_8_ = local_148;
    NetworkAddressHttpClient::request
              (__return_storage_ptr__,this_00,method,url,headers,expectedBodySize_00);
  }
  return __return_storage_ptr__;
}

Assistant:

KJ_IF_SOME(c, client) {
      return c->request(method, url, headers, expectedBodySize);
    }